

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

int64_t av1_block_error_c(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  
  if (block_size < 1) {
    iVar2 = 0;
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    iVar2 = 0;
    do {
      iVar1 = coeff[lVar4];
      iVar2 = iVar2 + (ulong)(uint)((iVar1 - dqcoeff[lVar4]) * (iVar1 - dqcoeff[lVar4]));
      iVar3 = iVar3 + (ulong)(uint)(iVar1 * iVar1);
      lVar4 = lVar4 + 1;
    } while (block_size != lVar4);
  }
  *ssz = iVar3;
  return iVar2;
}

Assistant:

int64_t av1_block_error_c(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                          intptr_t block_size, int64_t *ssz) {
  int i;
  int64_t error = 0, sqcoeff = 0;

  for (i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
    sqcoeff += coeff[i] * coeff[i];
  }

  *ssz = sqcoeff;
  return error;
}